

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_str.c
# Opt level: O0

void lj_str_resize(lua_State *L,MSize newmask)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  long *plVar4;
  void *__s;
  long lVar5;
  uint in_ESI;
  long in_RDI;
  GCobj *next;
  MSize h;
  GCobj *p;
  MSize i;
  GCRef *newhash;
  global_State *g;
  GCSize in_stack_ffffffffffffffb0;
  GCSize in_stack_ffffffffffffffb4;
  void *in_stack_ffffffffffffffb8;
  uint *puVar6;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  
  plVar4 = (long *)(ulong)*(uint *)(in_RDI + 8);
  if ((*(char *)((long)plVar4 + 0x59) != '\x03') && (in_ESI < 0x3ffffff)) {
    __s = lj_mem_realloc((lua_State *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                         in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,
                         in_stack_ffffffffffffffb0);
    memset(__s,0,(ulong)(in_ESI + 1) << 2);
    for (uVar3 = *(uint *)(plVar4 + 1); uVar3 != 0xffffffff; uVar3 = uVar3 - 1) {
      uVar1 = *(uint *)(*plVar4 + (ulong)uVar3 * 4);
      while (puVar6 = (uint *)(ulong)uVar1, puVar6 != (uint *)0x0) {
        uVar2 = *puVar6;
        *puVar6 = *(uint *)((long)__s + (ulong)(puVar6[2] & in_ESI) * 4);
        *(uint *)((long)__s + (ulong)(puVar6[2] & in_ESI) * 4) = uVar1;
        uVar1 = uVar2;
      }
    }
    lVar5 = (ulong)((int)plVar4[1] + 1) * 4;
    *(int *)(plVar4 + 10) = (int)plVar4[10] - (int)lVar5;
    plVar4[0x12] = lVar5 + plVar4[0x12];
    (*(code *)plVar4[8])(plVar4[9],*plVar4,lVar5,0);
    *(uint *)(plVar4 + 1) = in_ESI;
    *plVar4 = (long)__s;
  }
  return;
}

Assistant:

void lj_str_resize(lua_State *L, MSize newmask)
{
  global_State *g = G(L);
  GCRef *newhash;
  MSize i;
  if (g->gc.state == GCSsweepstring || newmask >= LJ_MAX_STRTAB-1)
    return;  /* No resizing during GC traversal or if already too big. */
  newhash = lj_mem_newvec(L, newmask+1, GCRef);
  memset(newhash, 0, (newmask+1)*sizeof(GCRef));
  for (i = g->strmask; i != ~(MSize)0; i--) {  /* Rehash old table. */
    GCobj *p = gcref(g->strhash[i]);
    while (p) {  /* Follow each hash chain and reinsert all strings. */
      MSize h = gco2str(p)->hash & newmask;
      GCobj *next = gcnext(p);
      /* NOBARRIER: The string table is a GC root. */
      setgcrefr(p->gch.nextgc, newhash[h]);
      setgcref(newhash[h], p);
      p = next;
    }
  }
  lj_mem_freevec(g, g->strhash, g->strmask+1, GCRef);
  g->strmask = newmask;
  g->strhash = newhash;
}